

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  int *piVar16;
  int64_t iVar17;
  double *pdVar18;
  TPZVec<int> *in_RSI;
  REAL mult [21];
  int hs;
  int nh;
  int h;
  TPZStack<int,_10> highsides;
  int is4_1;
  int is3_1;
  int is2_3;
  int is1_3;
  int is2_2;
  int is1_2;
  int d;
  int is4;
  int is3;
  int is2_1;
  int is1_1;
  int is0;
  int is2;
  int is1;
  int nsnodes;
  int is;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  undefined8 in_stack_fffffffffffffb30;
  double dVar19;
  TPZStack<int,_10> *in_stack_fffffffffffffb40;
  double in_stack_fffffffffffffb48;
  TPZFMatrix<double> *in_stack_fffffffffffffb50;
  double local_168 [21];
  int local_c0;
  int local_bc;
  int local_b8;
  TPZVec<int> local_a8 [2];
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  for (local_24 = 6; local_24 < 0x15; local_24 = local_24 + 1) {
    local_28 = pztopology::TPZPrism::NSideNodes(local_24);
    switch(local_28) {
    case 2:
      piVar16 = TPZVec<int>::operator[](local_10,(long)(local_24 + -6));
      if (0 < *piVar16) {
        local_2c = pztopology::TPZPrism::SideNodeLocId
                             ((int)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
        local_30 = pztopology::TPZPrism::SideNodeLocId
                             ((int)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar19 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar19 * dVar4 + dVar5 * dVar6;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar19 * dVar4 + dVar5 * dVar6;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar19 * dVar4 + dVar5 * dVar6;
      }
      break;
    case 3:
      piVar16 = TPZVec<int>::operator[](local_10,(long)(local_24 + -6));
      if (0 < *piVar16) {
        local_34 = 0;
        local_38 = 1;
        local_3c = 2;
        local_40 = 3;
        local_44 = 4;
        if (local_24 == 0x13) {
          local_3c = 5;
        }
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = (dVar19 + dVar4) * (dVar5 + dVar6) * dVar7;
        for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar19 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar4 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar5 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar6 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar7 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar8 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar9 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar10 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar11 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar12 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar13 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar14 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar1 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar2 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar3 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          *pdVar18 = (dVar13 + dVar14) * (dVar1 + dVar2) * dVar3 +
                     (dVar19 + dVar4) * (dVar5 + dVar6) * dVar7 +
                     (dVar8 + dVar9) * (dVar10 + dVar11) * dVar12;
        }
      }
      break;
    case 4:
      local_4c = pztopology::TPZPrism::SideNodeLocId
                           ((int)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
      local_50 = pztopology::TPZPrism::SideNodeLocId
                           ((int)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar19 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = dVar19 * dVar4;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar19 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar5 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar6 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = dVar19 * dVar4 + dVar5 * dVar6;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar19 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar5 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar6 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = dVar19 * dVar4 + dVar5 * dVar6;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar19 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar5 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      dVar6 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = dVar19 * dVar4 + dVar5 * dVar6;
      break;
    default:
      break;
    case 6:
      piVar16 = TPZVec<int>::operator[](local_10,(long)(local_24 + -6));
      if (0 < *piVar16) {
        local_54 = 0;
        local_58 = 4;
        local_5c = 2;
        local_60 = 5;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar19 * dVar4 * (dVar5 + dVar6);
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar8 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar9 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar10 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar11 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar12 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar13 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar14 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar11 * dVar12 * (dVar13 + dVar14) +
                   dVar19 * dVar4 * (dVar5 + dVar6) + dVar7 * dVar8 * (dVar9 + dVar10);
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar8 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar9 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar10 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar11 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar12 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar13 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar14 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar11 * dVar12 * (dVar13 + dVar14) +
                   dVar19 * dVar4 * (dVar5 + dVar6) + dVar7 * dVar8 * (dVar9 + dVar10);
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar19 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar8 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar9 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar10 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar11 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar12 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar13 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        dVar14 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                             (int64_t)in_stack_fffffffffffffb40);
        *pdVar18 = dVar11 * dVar12 * (dVar13 + dVar14) +
                   dVar19 * dVar4 * (dVar5 + dVar6) + dVar7 * dVar8 * (dVar9 + dVar10);
      }
    }
  }
  for (local_24 = 6; local_24 < 0x15; local_24 = local_24 + 1) {
    piVar16 = TPZVec<int>::operator[](local_10,(long)(local_24 + -6));
    if (0 < *piVar16) {
      TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffb40);
      pztopology::TPZPrism::HigherDimensionSides
                ((int)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                 (TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
      ;
      iVar17 = TPZVec<int>::NElements(local_a8);
      local_bc = (int)iVar17;
      for (local_b8 = 0; local_b8 < local_bc; local_b8 = local_b8 + 1) {
        piVar16 = TPZVec<int>::operator[](local_a8,(long)local_b8);
        local_c0 = *piVar16;
        iVar15 = pztopology::TPZPrism::NSideNodes(local_c0);
        if (iVar15 == 4) {
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar19 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          *pdVar18 = *pdVar18 + dVar19;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar19 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          *pdVar18 = *pdVar18 + dVar19;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          dVar19 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          *pdVar18 = *pdVar18 + dVar19;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          in_stack_fffffffffffffb50 = (TPZFMatrix<double> *)*pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                               (int64_t)in_stack_fffffffffffffb40);
          *pdVar18 = (double)in_stack_fffffffffffffb50 + *pdVar18;
        }
      }
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x188a04e);
    }
  }
  memcpy(local_168,&DAT_02097de0,0xa8);
  for (local_24 = 6; local_24 < 0x15; local_24 = local_24 + 1) {
    piVar16 = TPZVec<int>::operator[](local_10,(long)(local_24 + -6));
    if (0 < *piVar16) {
      dVar19 = local_168[local_24];
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = dVar19 * *pdVar18;
      dVar19 = local_168[local_24];
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = dVar19 * *pdVar18;
      in_stack_fffffffffffffb40 = (TPZStack<int,_10> *)local_168[local_24];
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = (double)in_stack_fffffffffffffb40 * *pdVar18;
      in_stack_fffffffffffffb48 = local_168[local_24];
      pdVar18 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffb50,(int64_t)in_stack_fffffffffffffb48,
                           (int64_t)in_stack_fffffffffffffb40);
      *pdVar18 = in_stack_fffffffffffffb48 * *pdVar18;
    }
  }
  return;
}

Assistant:

void TPZShapePrism::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        // 9 ribs
        for(is=6; is<NSides; is++)
        {
            int nsnodes = NSideNodes(is);
            switch(nsnodes)
            {
                case 2:
                {
                    if(nshape[is-6] < 1) continue;
                    int is1 = SideNodeLocId(is,0);
                    int is2 = SideNodeLocId(is,1);
                    phi(is,0) = phi(is1,0)*phi(is2,0);
                    dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
                    dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
                    dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
                }
                    break;
                case 3:
                {
                    if(nshape[is-6] < 1) continue;
                    int is0 = 0;
                    int is1 = 1;
                    int is2 = 2;
                    int is3 = 3;
                    int is4 = 4;
                    if(is == 19)
                    {
                        is2 = 5;
                    }
                    phi(is,0) = (phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*phi(is2,0);
                    int d;
                    for(d=0; d<3; d++)
                    {
                        dphi(d,is) =
                        (dphi(d,is0)+dphi(d,is3))*(phi(is1,0)+phi(is4,0))*phi(is2,0) +
                        (phi(is0,0)+phi(is3,0))*(dphi(d,is1)+dphi(d,is4))*phi(is2,0) +
                        (phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*dphi(d,is2);
                    }
                }
                    break;
                case 4:
                {
                    int is1 = SideNodeLocId(is,0);
                    int is2 = SideNodeLocId(is,2);
                    phi(is,0) = phi(is1,0)*phi(is2,0);
                    dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
                    dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
                    dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
                }
                    break;
                case 6:
                {
                    if(nshape[is-6] < 1) continue;
                    int is1 = 0;
                    int is2 = 4;
                    int is3 = 2;
                    int is4 = 5;
                    phi(is,0) = phi(is1,0)*phi(is2,0)*(phi(is3,0)+phi(is4,0));
                    dphi(0,is) = dphi(0,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(0,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(0,is3)+dphi(0,is4));
                    dphi(1,is) = dphi(1,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(1,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(1,is3)+dphi(1,is4));
                    dphi(2,is) = dphi(2,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(2,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(2,is3)+dphi(2,is4));
                }
                    break;
                default:
                    ;
            }
        }
        // Make the generating shape functions linear and unitary
        for(is=6; is<NSides; is++)
        {
            if(nshape[is-6] < 1) continue;
            TPZStack<int> highsides;
            HigherDimensionSides(is,highsides);
            int h, nh = highsides.NElements();
            for(h=0; h<nh; h++)
            {
                int hs = highsides[h];
                if(NSideNodes(hs) != 4) continue;
                phi(is,0) += phi(hs,0);
                dphi(0,is) += dphi(0,hs);
                dphi(1,is) += dphi(1,hs);
                dphi(2,is) += dphi(2,hs);
            }
        }
        REAL mult[] = {1.,1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,4.,27.,16.,16.,16.,27.,8.};
        for(is=6;is<NSides; is++)
        {
            if(nshape[is-6] < 1) continue;
            phi(is,0) *= mult[is];
            dphi(0,is) *= mult[is];
            dphi(1,is) *= mult[is];
            dphi(2,is) *= mult[is];
        }
        
    }